

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O2

size_t showShortOptions(poptOption *opt,FILE *fp,char *str)

{
  char cVar1;
  uint uVar2;
  char *__s;
  char *pcVar3;
  ushort **ppuVar4;
  size_t sVar5;
  size_t sVar6;
  poptOption *opt_00;
  void **ppvVar7;
  
  __s = str;
  if ((str == (char *)0x0) && (__s = (char *)calloc(1,300), __s == (char *)0x0)) {
    sVar6 = 0;
  }
  else {
    if (opt == (poptOption *)0x0) {
      sVar6 = 0;
    }
    else {
      sVar6 = 0;
      for (ppvVar7 = &opt->arg;
          ((((poptOption *)(ppvVar7 + -2))->longName != (char *)0x0 ||
           (*(char *)(ppvVar7 + -1) != '\0')) || (*ppvVar7 != (void *)0x0)); ppvVar7 = ppvVar7 + 6)
      {
        uVar2 = *(uint *)((long)ppvVar7 + -4);
        if ((uVar2 >> 0x1e & 1) == 0) {
          cVar1 = *(char *)(ppvVar7 + -1);
          if ((_poptArgMask & uVar2) != 0 || cVar1 == '\0') goto LAB_001061ca;
          pcVar3 = strchr(__s,(int)cVar1);
          if (((pcVar3 == (char *)0x0) && (ppuVar4 = __ctype_b_loc(), cVar1 != ' ')) &&
             (((*ppuVar4)[(int)cVar1] & 0x4000) != 0)) {
            sVar5 = strlen(__s);
            __s[sVar5] = cVar1;
          }
        }
        else {
LAB_001061ca:
          if ((_poptArgMask & uVar2) == 4) {
            opt_00 = (poptOption *)*ppvVar7;
            if ((poptOption *)*ppvVar7 == poptHelpOptions) {
              opt_00 = poptHelpOptionsI18N;
            }
            if (opt_00 != (poptOption *)0x0) {
              sVar6 = showShortOptions(opt_00,fp,__s);
            }
          }
        }
      }
    }
    if (__s != str) {
      if (*__s != '\0') {
        fprintf((FILE *)fp," [-%s]",__s);
        sVar5 = strlen(__s);
        sVar6 = sVar5 + 4;
      }
      free(__s);
    }
  }
  return sVar6;
}

Assistant:

static size_t showShortOptions(const struct poptOption * opt, FILE * fp,
		char * str)
{
    /* bufsize larger then the ascii set, lazy allocation on top level call. */
    size_t nb = (size_t)300;
    char * s = (str != NULL ? str : calloc((size_t)1, nb));
    size_t len = (size_t)0;

    if (s == NULL)
	return 0;

    if (opt != NULL)
    for (; (opt->longName || opt->shortName || opt->arg); opt++) {
	if (!F_ISSET(opt, DOC_HIDDEN) && opt->shortName && !poptArgType(opt))
	{
	    /* Display shortName iff unique printable non-space. */
	    if (!strchr(s, opt->shortName) && isprint((int)opt->shortName)
	     && opt->shortName != ' ')
		s[strlen(s)] = opt->shortName;
	} else if (poptArgType(opt) == POPT_ARG_INCLUDE_TABLE) {
	    void * arg = opt->arg;
	    /* XXX sick hack to preserve pretense of ABI. */
	    if (arg == poptHelpOptions)
		arg = poptHelpOptionsI18N;
	    if (arg)	/* XXX program error */
		len = showShortOptions(arg, fp, s);
	}
    } 

    /* On return to top level, print the short options, return print length. */
    if (s != str && *s != '\0') {
	fprintf(fp, " [-%s]", s);
	len = strlen(s) + sizeof(" [-]")-1;
    }
    if (s != str)
	free(s);
    return len;
}